

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

float stbir__filter_mitchell(float x,float s,void *user_data)

{
  void *user_data_local;
  undefined4 local_10;
  float s_local;
  float x_local;
  
  local_10 = x;
  if (x < 0.0) {
    local_10 = -x;
  }
  if (1.0 <= local_10) {
    if (2.0 <= local_10) {
      s_local = 0.0;
    }
    else {
      s_local = (local_10 * (local_10 * (36.0 - local_10 * 7.0) + -60.0) + 32.0) / 18.0;
    }
  }
  else {
    s_local = (local_10 * local_10 * (local_10 * 21.0 - 36.0) + 16.0) / 18.0;
  }
  return s_local;
}

Assistant:

static float stbir__filter_mitchell(float x, float s, void * user_data)
{
  STBIR__UNUSED(s);
  STBIR__UNUSED(user_data);

  if ( x < 0.0f ) x = -x;

  if (x < 1.0f)
    return (16.0f + x*x*(21.0f * x - 36.0f))/18.0f;
  else if (x < 2.0f)
    return (32.0f + x*(-60.0f + x*(36.0f - 7.0f*x)))/18.0f;

  return (0.0f);
}